

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

int Gia_ManFraigCheckCis(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *local_20;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsCi(pObj);
  local_20 = pObj;
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0xdf,"int Gia_ManFraigCheckCis(Gia_Man_t *, Gia_Obj_t *)");
  }
  while( true ) {
    iVar1 = Gia_ObjIsCi(local_20);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = Gia_ObjIsTravIdCurrent(p,local_20);
    if (iVar1 != 0) break;
    local_20 = local_20 + -1;
  }
  return 1;
}

Assistant:

int Gia_ManFraigCheckCis( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    for ( assert( Gia_ObjIsCi(pObj) ); Gia_ObjIsCi(pObj); pObj-- )
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            return 1;
    return 0;
}